

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

int ply_write_chunk_reverse(p_ply ply,void *anybuffer,size_t size)

{
  int iVar1;
  
  ply_reverse(anybuffer,size);
  iVar1 = ply_write_chunk(ply,anybuffer,size);
  ply_reverse(anybuffer,size);
  return iVar1;
}

Assistant:

static int ply_write_chunk_reverse(p_ply ply, void *anybuffer, size_t size) {
    int ret = 0;
    ply_reverse(anybuffer, size);
    ret = ply_write_chunk(ply, anybuffer, size);
    ply_reverse(anybuffer, size);
    return ret;
}